

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportMulti(HighsSimplexAnalysis *this,bool header)

{
  type pbVar1;
  byte in_SIL;
  long in_RDI;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string *format;
  string local_80 [32];
  string local_60 [48];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    if (*(double *)(in_RDI + 0x9d8) < 0.0) {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffff50);
      format = local_80;
      highsFormatToString_abi_cxx11_((char *)format,"       ");
      std::operator<<((ostream *)(pbVar1 + 0x10),format);
      std::__cxx11::string::~string(local_80);
    }
    else {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffff50);
      highsFormatToString_abi_cxx11_
                ((char *)local_60,"   %3d%%",(ulong)(uint)(int)(*(double *)(in_RDI + 0x9d8) * 100.0)
                );
      std::operator<<((ostream *)(pbVar1 + 0x10),local_60);
      std::__cxx11::string::~string(local_60);
    }
  }
  else {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff50);
    highsFormatToString_abi_cxx11_((char *)local_30,"  Multi");
    std::operator<<((ostream *)(pbVar1 + 0x10),local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportMulti(const bool header) {
  assert(analyse_simplex_runtime_data);
  if (header) {
    *analysis_log << highsFormatToString("  Multi");
  } else if (average_fraction_of_possible_minor_iterations_performed >= 0) {
    *analysis_log << highsFormatToString(
        "   %3" HIGHSINT_FORMAT "%%",
        (HighsInt)(100 *
                   average_fraction_of_possible_minor_iterations_performed));
  } else {
    *analysis_log << highsFormatToString("       ");
  }
}